

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxConditional::Resolve(FxConditional *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  FxBoolCast *this_00;
  undefined4 extraout_var_02;
  FxFloatCast *pFVar4;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  FCompileContext *x;
  FxExpression *local_80;
  FxExpression *e;
  undefined1 local_40 [7];
  bool result;
  ExpVal condval;
  FCompileContext *ctx_local;
  FxConditional *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    x = ctx;
    if (this->condition != (FxExpression *)0x0) {
      iVar2 = (*this->condition->_vptr_FxExpression[2])();
      this->condition = (FxExpression *)CONCAT44(extraout_var,iVar2);
    }
    if (this->truex != (FxExpression *)0x0) {
      x = ctx;
      iVar2 = (*this->truex->_vptr_FxExpression[2])();
      this->truex = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
    }
    if (this->falsex != (FxExpression *)0x0) {
      x = ctx;
      iVar2 = (*this->falsex->_vptr_FxExpression[2])();
      this->falsex = (FxExpression *)CONCAT44(extraout_var_01,iVar2);
    }
    if (((this->condition == (FxExpression *)0x0) || (this->truex == (FxExpression *)0x0)) ||
       (this->falsex == (FxExpression *)0x0)) {
      if (this != (FxConditional *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxConditional *)0x0;
    }
    else {
      if (this->truex->ValueType == this->falsex->ValueType) {
        (this->super_FxExpression).ValueType = this->truex->ValueType;
      }
      else if ((this->truex->ValueType == (PType *)TypeBool) &&
              (this->falsex->ValueType == (PType *)TypeBool)) {
        (this->super_FxExpression).ValueType = (PType *)TypeBool;
      }
      else {
        bVar1 = FxExpression::IsInteger(this->truex);
        if ((bVar1) && (bVar1 = FxExpression::IsInteger(this->falsex), bVar1)) {
          (this->super_FxExpression).ValueType = (PType *)TypeSInt32;
        }
        else {
          bVar1 = FxExpression::IsNumeric(this->truex);
          if ((bVar1) && (bVar1 = FxExpression::IsNumeric(this->falsex), bVar1)) {
            (this->super_FxExpression).ValueType = (PType *)TypeFloat64;
          }
          else {
            bVar1 = FxExpression::IsPointer(this->truex);
            if ((bVar1) && ((PPointer *)this->falsex->ValueType == TypeNullPtr)) {
              (this->super_FxExpression).ValueType = this->truex->ValueType;
            }
            else {
              bVar1 = FxExpression::IsPointer(this->falsex);
              if ((bVar1) && ((PPointer *)this->truex->ValueType == TypeNullPtr)) {
                (this->super_FxExpression).ValueType = this->falsex->ValueType;
              }
              else {
                (this->super_FxExpression).ValueType = &TypeVoid->super_PType;
              }
            }
          }
        }
      }
      iVar2 = PType::GetRegType((this->super_FxExpression).ValueType);
      if (iVar2 == 0x80) {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Incompatible types for ?: operator"
                  );
        if (this != (FxConditional *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxConditional *)0x0;
      }
      else {
        if (this->condition->ValueType != (PType *)TypeBool) {
          this_00 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)x);
          x = (FCompileContext *)this->condition;
          FxBoolCast::FxBoolCast(this_00,(FxExpression *)x,true);
          this->condition = (FxExpression *)this_00;
          if (this->condition != (FxExpression *)0x0) {
            x = ctx;
            iVar2 = (*this->condition->_vptr_FxExpression[2])();
            this->condition = (FxExpression *)CONCAT44(extraout_var_02,iVar2);
          }
          if (this->condition == (FxExpression *)0x0) {
            if (this != (FxConditional *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
        }
        uVar3 = (*this->condition->_vptr_FxExpression[3])();
        if ((uVar3 & 1) == 0) {
          bVar1 = FxExpression::IsFloat(&this->super_FxExpression);
          if (bVar1) {
            iVar2 = PType::GetRegType(this->truex->ValueType);
            if (iVar2 != 1) {
              pFVar4 = (FxFloatCast *)FxExpression::operator_new((FxExpression *)0x30,(size_t)x);
              x = (FCompileContext *)this->truex;
              FxFloatCast::FxFloatCast(pFVar4,(FxExpression *)x);
              this->truex = (FxExpression *)pFVar4;
              if (this->truex != (FxExpression *)0x0) {
                x = ctx;
                iVar2 = (*this->truex->_vptr_FxExpression[2])();
                this->truex = (FxExpression *)CONCAT44(extraout_var_03,iVar2);
              }
            }
            iVar2 = PType::GetRegType(this->falsex->ValueType);
            if (iVar2 != 1) {
              pFVar4 = (FxFloatCast *)FxExpression::operator_new((FxExpression *)0x30,(size_t)x);
              FxFloatCast::FxFloatCast(pFVar4,this->falsex);
              this->falsex = (FxExpression *)pFVar4;
              if (this->falsex != (FxExpression *)0x0) {
                iVar2 = (*this->falsex->_vptr_FxExpression[2])(this->falsex,ctx);
                this->falsex = (FxExpression *)CONCAT44(extraout_var_04,iVar2);
              }
            }
          }
        }
        else {
          FxConstant::GetValue((FxConstant *)local_40);
          bVar1 = ExpVal::GetBool((ExpVal *)local_40);
          if (bVar1) {
            this_local = (FxConditional *)this->truex;
            local_80 = this->falsex;
          }
          else {
            this_local = (FxConditional *)this->falsex;
            local_80 = this->truex;
          }
          if (local_80 != (FxExpression *)0x0) {
            (*local_80->_vptr_FxExpression[1])();
          }
          this->truex = (FxExpression *)0x0;
          this->falsex = (FxExpression *)0x0;
          if (this != (FxConditional *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          ExpVal::~ExpVal((ExpVal *)local_40);
        }
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxConditional::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(condition, ctx);
	RESOLVE(truex, ctx);
	RESOLVE(falsex, ctx);
	ABORT(condition && truex && falsex);

	if (truex->ValueType == falsex->ValueType)
		ValueType = truex->ValueType;
	else if (truex->ValueType == TypeBool && falsex->ValueType == TypeBool)
		ValueType = TypeBool;
	else if (truex->IsInteger() && falsex->IsInteger())
		ValueType = TypeSInt32;
	else if (truex->IsNumeric() && falsex->IsNumeric())
		ValueType = TypeFloat64;
	else if (truex->IsPointer() && falsex->ValueType == TypeNullPtr)
		ValueType = truex->ValueType;
	else if (falsex->IsPointer() && truex->ValueType == TypeNullPtr)
		ValueType = falsex->ValueType;
	else
		ValueType = TypeVoid;
	//else if (truex->ValueType != falsex->ValueType)

	if (ValueType->GetRegType() == REGT_NIL)
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible types for ?: operator");
		delete this;
		return nullptr;
	}

	if (condition->ValueType != TypeBool)
	{
		condition = new FxBoolCast(condition);
		SAFE_RESOLVE(condition, ctx);
	}

	if (condition->isConstant())
	{
		ExpVal condval = static_cast<FxConstant *>(condition)->GetValue();
		bool result = condval.GetBool();

		FxExpression *e = result? truex:falsex;
		delete (result? falsex:truex);
		falsex = truex = nullptr;
		delete this;
		return e;
	}

	if (IsFloat())
	{
		if (truex->ValueType->GetRegType() != REGT_FLOAT)
		{
			truex = new FxFloatCast(truex);
			RESOLVE(truex, ctx);
		}
		if (falsex->ValueType->GetRegType() != REGT_FLOAT)
		{
			falsex = new FxFloatCast(falsex);
			RESOLVE(falsex, ctx);
		}
	}

	return this;
}